

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closure.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  squirrel_error *e;
  string local_c0 [32];
  int local_a0;
  allocator local_99;
  int n;
  undefined1 local_68 [8];
  VMStd vm;
  
  vm.super_VM.root_table_._M_t.
  super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
  super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
  super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl._4_4_ = 0;
  squall::VMStd::VMStd((VMStd *)local_68,0x400);
  squall::VMStd::dofile((VMStd *)local_68,"closure.nut");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&n,"foo",&local_99);
  squall::VM::
  defun<void(*)(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>
            ((VM *)local_68,(string *)&n,foo);
  std::__cxx11::string::~string((string *)&n);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"bar",(allocator *)((long)&e + 7));
  iVar1 = squall::VM::call<int>((VM *)local_68,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  local_a0 = iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"**** return value: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_a0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  squall::VMStd::~VMStd((VMStd *)local_68);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("closure.nut");

        vm.defun("foo", &foo);
        int n = vm.call<int>("bar");
        std::cout << "**** return value: " << n << std::endl;
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}